

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetFacialExpressionBlendShapePropertiesML
                   (XrFacialExpressionClientML facialExpressionClient,
                   XrFacialExpressionBlendShapeGetInfoML *blendShapeGetInfo,uint32_t blendShapeCount
                   ,XrFacialExpressionBlendShapePropertiesML *blendShapes)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  XrResult XVar3;
  long lVar4;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar5;
  XrFacialExpressionClientML_T *in_stack_fffffffffffffd28;
  allocator local_2ca;
  allocator local_2c9;
  GenValidUsageXrInstanceInfo *local_2c8;
  string local_2c0;
  string local_2a0;
  XrFacialExpressionClientML facialExpressionClient_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3ba224d0;
  facialExpressionClient_local = facialExpressionClient;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrFacialExpressionClientML_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&facialExpressionClient_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrFacialExpressionClientMLHandle(&facialExpressionClient_local);
  if (VVar1 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,
                    "Invalid XrFacialExpressionClientML handle \"facialExpressionClient\" ");
    HandleToHexString<XrFacialExpressionClientML_T*>(in_stack_fffffffffffffd28);
    std::operator<<((ostream *)&oss,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::string
              ((string *)&local_2c0,
               "VUID-xrGetFacialExpressionBlendShapePropertiesML-facialExpressionClient-parameter",
               &local_2c9);
    std::__cxx11::string::string
              ((string *)&local_2a0,"xrGetFacialExpressionBlendShapePropertiesML",&local_2ca);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2c0,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
    goto LAB_0021c172;
  }
  pVar5 = HandleInfo<XrFacialExpressionClientML_T_*>::getWithInstanceInfo
                    (&g_facialexpressionclientml_info,facialExpressionClient_local);
  local_2c8 = pVar5.second;
  if (blendShapeGetInfo == (XrFacialExpressionBlendShapeGetInfoML *)0x0) {
    std::__cxx11::string::string
              ((string *)&oss,
               "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
               (allocator *)&local_258);
    std::__cxx11::string::string
              ((string *)&local_2c0,"xrGetFacialExpressionBlendShapePropertiesML",&local_2c9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d8,&objects_info);
    std::__cxx11::string::string
              ((string *)&local_2a0,
               "Invalid NULL for XrFacialExpressionBlendShapeGetInfoML \"blendShapeGetInfo\" which is not optional and must be non-NULL"
               ,&local_2ca);
    CoreValidLogMessage(local_2c8,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d8,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    this = &local_1d8;
  }
  else {
    std::__cxx11::string::string
              ((string *)&oss,"xrGetFacialExpressionBlendShapePropertiesML",(allocator *)&local_2c0)
    ;
    XVar2 = ValidateXrStruct(local_2c8,(string *)&oss,&objects_info,false,true,blendShapeGetInfo);
    std::__cxx11::string::~string((string *)&oss);
    if (XVar2 == XR_SUCCESS) {
      if (blendShapes == (XrFacialExpressionBlendShapePropertiesML *)0x0 || blendShapeCount != 0) {
        if (blendShapeCount != 0 && blendShapes == (XrFacialExpressionBlendShapePropertiesML *)0x0)
        {
          std::__cxx11::string::string
                    ((string *)&oss,
                     "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                     (allocator *)&local_258);
          std::__cxx11::string::string
                    ((string *)&local_2c0,"xrGetFacialExpressionBlendShapePropertiesML",&local_2c9);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_220,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_2a0,
                     "Invalid NULL for XrFacialExpressionBlendShapePropertiesML \"blendShapes\" is which not optional since \"blendShapeCount\" is set and must be non-NULL"
                     ,&local_2ca);
          CoreValidLogMessage(local_2c8,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c0,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_220,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          this = &local_220;
          goto LAB_0021c152;
        }
        XVar2 = XR_SUCCESS;
        XVar3 = XR_SUCCESS;
        if (blendShapes == (XrFacialExpressionBlendShapePropertiesML *)0x0) goto LAB_0021c172;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,
                   "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeCount-arraylength",
                   (allocator *)&local_258);
        std::__cxx11::string::string
                  ((string *)&local_2c0,"xrGetFacialExpressionBlendShapePropertiesML",&local_2c9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_208,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2a0,
                   "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeCount is non-optional and must be greater than 0"
                   ,&local_2ca);
        CoreValidLogMessage(local_2c8,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c0,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_208,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_208);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&oss);
        XVar3 = XR_ERROR_VALIDATION_FAILURE;
      }
      XVar2 = XVar3;
      lVar4 = (ulong)blendShapeCount + 1;
      do {
        lVar4 = lVar4 + -1;
        if (lVar4 == 0) goto LAB_0021c172;
        std::__cxx11::string::string
                  ((string *)&oss,"xrGetFacialExpressionBlendShapePropertiesML",
                   (allocator *)&local_2c0);
        XVar3 = ValidateXrStruct(local_2c8,(string *)&oss,&objects_info,true,true,blendShapes);
        blendShapes = blendShapes + 1;
        std::__cxx11::string::~string((string *)&oss);
        XVar2 = XR_SUCCESS;
      } while (XVar3 == XR_SUCCESS);
      std::__cxx11::string::string
                ((string *)&oss,
                 "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                 (allocator *)&local_258);
      std::__cxx11::string::string
                ((string *)&local_2c0,"xrGetFacialExpressionBlendShapePropertiesML",&local_2c9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_238,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_2a0,
                 "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapes is invalid",
                 &local_2ca);
      CoreValidLogMessage(local_2c8,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_238,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      this = &local_238;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,
                 "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
                 (allocator *)&local_258);
      std::__cxx11::string::string
                ((string *)&local_2c0,"xrGetFacialExpressionBlendShapePropertiesML",&local_2c9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_2a0,
                 "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeGetInfo is invalid"
                 ,&local_2ca);
      CoreValidLogMessage(local_2c8,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2c0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f0,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      this = &local_1f0;
    }
  }
LAB_0021c152:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&oss);
  XVar2 = XR_ERROR_VALIDATION_FAILURE;
LAB_0021c172:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrGetFacialExpressionBlendShapePropertiesML(
XrFacialExpressionClientML facialExpressionClient,
const XrFacialExpressionBlendShapeGetInfoML* blendShapeGetInfo,
uint32_t blendShapeCount,
XrFacialExpressionBlendShapePropertiesML* blendShapes) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(facialExpressionClient, XR_OBJECT_TYPE_FACIAL_EXPRESSION_CLIENT_ML);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrFacialExpressionClientMLHandle(&facialExpressionClient);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrFacialExpressionClientML handle \"facialExpressionClient\" ";
                oss << HandleToHexString(facialExpressionClient);
                CoreValidLogMessage(nullptr, "VUID-xrGetFacialExpressionBlendShapePropertiesML-facialExpressionClient-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_facialexpressionclientml_info.getWithInstanceInfo(facialExpressionClient);
        GenValidUsageXrHandleInfo *gen_facialexpressionclientml_info = info_with_instance.first;
        (void)gen_facialexpressionclientml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == blendShapeGetInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                "Invalid NULL for XrFacialExpressionBlendShapeGetInfoML \"blendShapeGetInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrFacialExpressionBlendShapeGetInfoML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                                        true, true, blendShapeGetInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeGetInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                objects_info,
                                "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeGetInfo is invalid");
            return xr_result;
        }
        // Non-optional array length must be non-zero
        if (0 >= blendShapeCount && nullptr != blendShapes) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapeCount-arraylength",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                objects_info,
                                "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapeCount is non-optional and must be greater than 0");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
        // Pointer/array variable with a length variable.  Make sure that
        // if length variable is non-zero that the pointer is not NULL
        if (nullptr == blendShapes && 0 != blendShapeCount) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                "Invalid NULL for XrFacialExpressionBlendShapePropertiesML \"blendShapes\" is which not "
                                "optional since \"blendShapeCount\" is set and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        if (blendShapes) {
            for (uint32_t value_blendshapes_inc = 0; value_blendshapes_inc < blendShapeCount; ++value_blendshapes_inc) {
                // Validate that the structure XrFacialExpressionBlendShapePropertiesML is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrGetFacialExpressionBlendShapePropertiesML", objects_info,
                                                                true, true, &blendShapes[value_blendshapes_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrGetFacialExpressionBlendShapePropertiesML-blendShapes-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetFacialExpressionBlendShapePropertiesML",
                                        objects_info,
                                        "Command xrGetFacialExpressionBlendShapePropertiesML param blendShapes is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}